

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.cpp
# Opt level: O1

void __thiscall Mempool::retrieve(Mempool *this,Chunk *block)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  int iVar3;
  mapped_type *ppCVar4;
  int iVar5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  int index;
  int local_1c;
  
  local_1c = block->capacity;
  block->length = 0;
  block->head = 0;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mp_mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  uVar1 = (this->mp_pool)._M_h._M_bucket_count;
  uVar6 = (ulong)(long)local_1c % uVar1;
  p_Var7 = (this->mp_pool)._M_h._M_buckets[uVar6];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var7->_M_nxt, p_Var8 = p_Var7, local_1c != *(int *)&p_Var7->_M_nxt[1]._M_nxt)) {
    while (p_Var7 = p_Var2, p_Var2 = p_Var7->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)(long)*(int *)&p_Var2[1]._M_nxt % uVar1 != uVar6) ||
         (p_Var8 = p_Var7, local_1c == *(int *)&p_Var2[1]._M_nxt)) goto LAB_00105526;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_00105526:
  if ((p_Var8 != (__node_base_ptr)0x0) && (p_Var8->_M_nxt != (_Hash_node_base *)0x0)) {
    ppCVar4 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,&local_1c);
    block->next = *ppCVar4;
    ppCVar4 = std::__detail::
              _Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<int,_std::pair<const_int,_Chunk_*>,_std::allocator<std::pair<const_int,_Chunk_*>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)this,&local_1c);
    *ppCVar4 = block;
    iVar3 = block->capacity;
    iVar5 = iVar3 + 0x3ff;
    if (-1 < iVar3) {
      iVar5 = iVar3;
    }
    this->mp_left_size_kb = this->mp_left_size_kb + (long)(iVar5 >> 10);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mp_mutex);
    return;
  }
  __assert_fail("mp_pool.find(index) != mp_pool.end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/mem_pool.cpp"
                ,0x57,"void Mempool::retrieve(Chunk *)");
}

Assistant:

void Mempool::retrieve(Chunk *block)
{
    int index = block->capacity;
    block->length = 0;
    block->head = 0;

    lock_guard<mutex> lck(mp_mutex);
    assert(mp_pool.find(index) != mp_pool.end());

    block->next = mp_pool[index];
    mp_pool[index] = block;
    mp_left_size_kb += block->capacity/1024;
}